

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ScaleLayerParams::MergeFrom(ScaleLayerParams *this,ScaleLayerParams *from)

{
  void *pvVar1;
  LogMessage *other;
  WeightParams *pWVar2;
  WeightParams *pWVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x9632);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(&this->shapescale_,&from->shapescale_);
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(&this->shapebias_,&from->shapebias_);
  if ((from != (ScaleLayerParams *)&_ScaleLayerParams_default_instance_) &&
     (from->scale_ != (WeightParams *)0x0)) {
    pWVar2 = mutable_scale(this);
    pWVar3 = from->scale_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  if ((from != (ScaleLayerParams *)&_ScaleLayerParams_default_instance_) &&
     (from->bias_ != (WeightParams *)0x0)) {
    pWVar2 = mutable_bias(this);
    pWVar3 = from->bias_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  if (from->hasbias_ == true) {
    this->hasbias_ = true;
  }
  return;
}

Assistant:

void ScaleLayerParams::MergeFrom(const ScaleLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ScaleLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  shapescale_.MergeFrom(from.shapescale_);
  shapebias_.MergeFrom(from.shapebias_);
  if (from.has_scale()) {
    mutable_scale()->::CoreML::Specification::WeightParams::MergeFrom(from.scale());
  }
  if (from.has_bias()) {
    mutable_bias()->::CoreML::Specification::WeightParams::MergeFrom(from.bias());
  }
  if (from.hasbias() != 0) {
    set_hasbias(from.hasbias());
  }
}